

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkRetimeWithClassesNtk(Abc_Ntk_t *pNtk,Vec_Int_t *vClasses,Vec_Int_t **pvClasses,int fVerbose)

{
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *pMan;
  Aig_Man_t *pMan_00;
  Abc_Ntk_t *pNtk_01;
  Abc_Ntk_t *pAVar1;
  
  pNtk_00 = Abc_NtkStrash(pNtk,0,1,0);
  pMan = Abc_NtkToDar(pNtk_00,0,1);
  pMan_00 = Abc_NtkRetimeWithClassesAig(pMan,vClasses,pvClasses,fVerbose);
  pNtk_01 = Abc_NtkFromDarSeqSweep(pNtk_00,pMan_00);
  pAVar1 = Abc_NtkToLogic(pNtk_01);
  Abc_NtkDelete(pNtk_01);
  Abc_NtkDelete(pNtk_00);
  Aig_ManStop(pMan_00);
  Aig_ManStop(pMan);
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkRetimeWithClassesNtk( Abc_Ntk_t * pNtk, Vec_Int_t * vClasses, Vec_Int_t ** pvClasses, int fVerbose )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    extern Abc_Ntk_t * Abc_NtkFromDarSeqSweep( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan );
    Abc_Ntk_t * pNtkAig, * pNtkAigRet, * pNtkRes;
    Aig_Man_t * pMan, * pManNew;
    pNtkAig    = Abc_NtkStrash( pNtk, 0, 1, 0 );
    pMan       = Abc_NtkToDar( pNtkAig, 0, 1 );
    pManNew    = Abc_NtkRetimeWithClassesAig( pMan, vClasses, pvClasses, fVerbose );
    pNtkAigRet = Abc_NtkFromDarSeqSweep( pNtkAig, pManNew );
    pNtkRes    = Abc_NtkToLogic( pNtkAigRet );
    Abc_NtkDelete( pNtkAigRet );
    Abc_NtkDelete( pNtkAig );
    Aig_ManStop( pManNew );
    Aig_ManStop( pMan );
    return pNtkRes;
}